

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::CBString(CBString *this,int len,char *s)

{
  CBStringException *pCVar1;
  uchar *puVar2;
  allocator local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  CBStringException bstr__cppwrapper_exception;
  size_t sslen;
  char *s_local;
  int len_local;
  CBString *this_local;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_0026f840;
  if (s != (char *)0x0) {
    bstr__cppwrapper_exception.msg.field_2._8_8_ = strlen(s);
    if (0x7ffffffe < (ulong)bstr__cppwrapper_exception.msg.field_2._8_8_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_70,"CBString::Failure in (char *) constructor, string too large",
                 &local_71);
      CBStringException::CBStringException((CBStringException *)local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar1,(CBStringException *)local_50);
      __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    (this->super_tagbstring).slen = (int)bstr__cppwrapper_exception.msg.field_2._8_8_;
    (this->super_tagbstring).mlen = (this->super_tagbstring).slen + 1;
    if ((this->super_tagbstring).mlen < len) {
      (this->super_tagbstring).mlen = len;
    }
    puVar2 = (uchar *)malloc((long)(this->super_tagbstring).mlen);
    (this->super_tagbstring).data = puVar2;
    if (puVar2 != (uchar *)0x0) {
      memcpy((this->super_tagbstring).data,s,(long)((this->super_tagbstring).slen + 1));
      return;
    }
  }
  (this->super_tagbstring).data = (uchar *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"CBString::Failure in (int len, char *) constructor",&local_d1);
  CBStringException::CBStringException((CBStringException *)local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar1,(CBStringException *)local_b0);
  __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (int len, const char *s) {
	if (s) {
		size_t sslen = strlen (s);
		if (sslen >= INT_MAX) bstringThrow ("Failure in (char *) constructor, string too large")
		slen = (int) sslen;
		mlen = slen + 1;
		if (mlen < len) mlen = len;
		if (NULL != (data = (unsigned char *) bstr__alloc (mlen))) {
			bstr__memcpy (data, s, slen + 1);
			return;
		}
	}
	data = NULL;
	bstringThrow ("Failure in (int len, char *) constructor");
}